

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

string * cfd::core::StringUtil::Join
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *str_list,string *separate_word)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  pointer __value;
  size_type sVar4;
  stringstream ss;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1c0;
  stringstream local_1b0 [16];
  ostream_type local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  __value = (str_list->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1c0._M_stream = local_1a0;
  local_1c0._M_string = (separate_word->_M_dataplus)._M_p;
  lVar3 = (long)(str_list->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__value >> 5;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      std::
      ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
      ::operator=(&local_1c0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__value);
      __value = (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __value + 1);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  ::std::__cxx11::stringbuf::str();
  uVar1 = __return_storage_ptr__->_M_string_length;
  sVar2 = strlen((separate_word->_M_dataplus)._M_p);
  sVar4 = uVar1 - sVar2;
  if (sVar2 <= uVar1) {
    __return_storage_ptr__->_M_string_length = sVar4;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar4] = '\0';
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string StringUtil::Join(
    const std::vector<std::string> &str_list,
    const std::string &separate_word) {
  std::stringstream ss;
  std::copy(
      str_list.begin(), str_list.end(),
      std::ostream_iterator<std::string>(ss, separate_word.c_str()));
  std::string result = ss.str();

  if (result.size() < std::char_traits<char>::length(separate_word.c_str()))
    return result;

  result.erase(
      result.size() - std::char_traits<char>::length(separate_word.c_str()));
  return result;
}